

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

DecodeResult * bech32::Decode(DecodeResult *__return_storage_ptr__,string *str,CharLimit limit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long lVar4;
  bool bVar5;
  uint32_t uVar6;
  char __c;
  CharLimit CVar7;
  ulong uVar8;
  Encoding EVar9;
  CharLimit __res;
  long in_FS_OFFSET;
  data values;
  vector<int,_std::allocator<int>_> errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  string hrp;
  allocator_type local_b1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  CharLimit CVar10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar5 = anon_unknown_0::CheckCharacters(str,&local_98);
  if (bVar5) {
    CVar7 = str->_M_string_length;
    if (CVar7 == 0) {
LAB_003f1e6a:
      __res = 0xffffffffffffffff;
    }
    else {
      CVar10 = CVar7;
      do {
        __res = CVar10 - 1;
        if (CVar10 == 0) goto LAB_003f1e6a;
        lVar4 = CVar10 - 1;
        CVar10 = __res;
      } while ((str->_M_dataplus)._M_p[lVar4] != '1');
    }
    if ((CVar7 <= limit) && (__res - 1 < 0xfffffffffffffffe && __res + 6 < CVar7)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b0,CVar7 + ~__res,(allocator_type *)&local_58);
      if (str->_M_string_length != __res + 1) {
        uVar8 = 0;
        do {
          if ((anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[uVar8 + __res + 1]]
              == 0xff) {
            __return_storage_ptr__->encoding = INVALID;
            (__return_storage_ptr__->hrp)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->hrp).field_2;
            (__return_storage_ptr__->hrp)._M_string_length = 0;
            (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->data).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->data).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->data).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            goto LAB_003f20ee;
          }
          local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] =
               (anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[uVar8 + __res + 1]];
          uVar8 = uVar8 + 1;
        } while (uVar8 < str->_M_string_length + ~__res);
      }
      paVar2 = &local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&local_58,__res);
      if (__res != 0) {
        CVar7 = 0;
        do {
          cVar3 = (str->_M_dataplus)._M_p[CVar7];
          __c = cVar3 + ' ';
          if (0x19 < (byte)(cVar3 + 0xbfU)) {
            __c = cVar3;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_58,__c);
          CVar7 = CVar7 + 1;
        } while (__res != CVar7);
      }
      anon_unknown_0::PreparePolynomialCoefficients(&local_78,&local_58,&local_b0);
      uVar6 = anon_unknown_0::PolyMod(&local_78);
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      EVar9 = (uint)(uVar6 == 0x2bc830a3) * 2;
      if (uVar6 == 1) {
        EVar9 = BECH32;
      }
      if (EVar9 == INVALID) {
        __return_storage_ptr__->encoding = INVALID;
        (__return_storage_ptr__->hrp)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->hrp).field_2;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->hrp)._M_string_length = 0;
        (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + -6),&local_b1);
        __return_storage_ptr__->encoding = EVar9;
        paVar1 = &(__return_storage_ptr__->hrp).field_2;
        (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->hrp).field_2 + 8) = local_58.field_2._8_8_
          ;
        }
        else {
          (__return_storage_ptr__->hrp)._M_dataplus._M_p = local_58._M_dataplus._M_p;
          (__return_storage_ptr__->hrp).field_2._M_allocated_capacity =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->hrp)._M_string_length = local_58._M_string_length;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_58._M_dataplus._M_p = (pointer)paVar2;
      }
      (__return_storage_ptr__->data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
LAB_003f20ee:
      if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_003f203d;
    }
  }
  __return_storage_ptr__->encoding = INVALID;
  (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hrp).field_2;
  (__return_storage_ptr__->hrp)._M_string_length = 0;
  (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_003f203d:
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

DecodeResult Decode(const std::string& str, CharLimit limit) {
    std::vector<int> errors;
    if (!CheckCharacters(str, errors)) return {};
    size_t pos = str.rfind('1');
    if (str.size() > limit) return {};
    if (pos == str.npos || pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        return {};
    }
    data values(str.size() - 1 - pos);
    for (size_t i = 0; i < str.size() - 1 - pos; ++i) {
        unsigned char c = str[i + pos + 1];
        int8_t rev = CHARSET_REV[c];

        if (rev == -1) {
            return {};
        }
        values[i] = rev;
    }
    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }
    Encoding result = VerifyChecksum(hrp, values);
    if (result == Encoding::INVALID) return {};
    return {result, std::move(hrp), data(values.begin(), values.end() - CHECKSUM_SIZE)};
}